

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionController::SetWitnessStack
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,uint32_t witness_index,
          string *hex_string)

{
  ConfidentialTransactionController *in_R8;
  ByteData *in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  Txid *in_stack_ffffffffffffffd8;
  
  core::ByteData::ByteData((ByteData *)&stack0xffffffffffffffc8,(string *)in_R8);
  SetWitnessStack(in_R8,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                  in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  core::ByteData::~ByteData((ByteData *)0x558ad9);
  return;
}

Assistant:

void ConfidentialTransactionController::SetWitnessStack(
    const Txid& txid, uint32_t vout, uint32_t witness_index,
    const std::string& hex_string) {
  SetWitnessStack(txid, vout, witness_index, ByteData(hex_string));
}